

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_macro_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitMacroTest_x_iutest_x_CXX14_Test::Body(iu_UnitMacroTest_x_iutest_x_CXX14_Test *this)

{
  int *in_R9;
  iuCodeMessage local_1e8;
  AssertionResult iutest_ar;
  Fixed local_190;
  
  local_1e8.m_message._M_dataplus._M_p._0_4_ = 1;
  local_190.super_Message.m_stream.super_iu_stringstream._0_4_ =
       local_1e8.m_message._M_dataplus._M_p._0_4_;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x168916,"1",(char *)&local_190,(int *)&local_1e8,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_macro_tests.cpp"
               ,0x35,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_190);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(UnitMacroTest, CXX14)
{
    IUTEST_EXPECT_EQ(1, IUTEST_HAS_CXX11);
}